

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core>
helics::CoreFactory::FindOrCreate(CoreType type,string_view coreName,string_view configureString)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  undefined1 uVar2;
  element_type *peVar3;
  shared_ptr<helics::Core> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_ptr *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  shared_ptr<helics::Core> sVar5;
  shared_ptr<helics::Core> *core;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  shared_ptr<helics::Core> *this;
  CoreType in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  shared_ptr<helics::Core> local_58;
  CoreType in_stack_ffffffffffffffbc;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  name._M_len._4_4_ = in_stack_ffffffffffffff84;
  name._M_len._0_4_ = in_stack_ffffffffffffff80;
  name._M_str = in_stack_ffffffffffffff88;
  findCore(name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  _Var4._M_pi = extraout_RDX;
  if (!bVar1) {
    name_00._M_len._4_4_ = in_stack_ffffffffffffff84;
    name_00._M_len._0_4_ = in_stack_ffffffffffffff80;
    name_00._M_str = in_stack_ffffffffffffff88;
    makeCore(in_stack_ffffffffffffff7c,name_00);
    this = &local_58;
    std::shared_ptr<helics::Core>::operator=
              (this,(shared_ptr<helics::Core> *)
                    CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x4fa470);
    peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4fa47a);
    uStack_20 = (undefined4)in_R9;
    uStack_1c = (undefined4)((ulong)in_R9 >> 0x20);
    (*peVar3->_vptr_Core[2])(peVar3,in_R8,in_R9);
    uVar2 = registerCore(in_RDX,in_stack_ffffffffffffffbc);
    _Var4._M_pi = extraout_RDX_00;
    if (!(bool)uVar2) {
      name_01._M_len._4_4_ = uStack_1c;
      name_01._M_len._0_4_ = uStack_20;
      name_01._M_str = in_stack_ffffffffffffff88;
      findCore(name_01);
      std::shared_ptr<helics::Core>::operator=
                (this,(shared_ptr<helics::Core> *)CONCAT17(uVar2,in_stack_ffffffffffffff38));
      std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x4fa4fc);
      std::__shared_ptr::operator_cast_to_bool(in_RDI);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  sVar5.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  sVar5.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar5.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core>
    FindOrCreate(CoreType type, std::string_view coreName, std::string_view configureString)
{
    std::shared_ptr<Core> core = findCore(coreName);
    if (core) {
        return core;
    }
    core = makeCore(type, coreName);
    core->configure(configureString);

    if (!registerCore(core, type)) {
        core = findCore(coreName);
        if (core) {
            return core;
        }
    }

    return core;
}